

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

void Col_SortWords(Col_Word *first,Col_Word *last,Col_WordCompareProc *proc,
                  Col_ClientData clientData)

{
  Col_Word CVar1;
  Col_Word CVar2;
  Col_WordCompareProc *pCVar3;
  int iVar4;
  Col_Word *pCVar5;
  Col_Word *pCVar6;
  bool bVar7;
  Col_Word tmp_5;
  Col_Word tmp_4;
  Col_Word tmp_3;
  Col_Word tmp_2;
  Col_Word tmp_1;
  Col_Word tmp;
  Col_Word v;
  Col_Word *q;
  Col_Word *p;
  Col_Word *k;
  Col_Word *j;
  Col_Word *i;
  Col_ClientData clientData_local;
  Col_WordCompareProc *proc_local;
  Col_Word *last_local;
  Col_Word *first_local;
  
  proc_local = (Col_WordCompareProc *)last;
  last_local = first;
  while (last_local < proc_local) {
    q = last_local + -1;
    v = (Col_Word)proc_local;
    k = (Col_Word *)proc_local;
    CVar1 = *(Col_Word *)proc_local;
    pCVar6 = q;
    while( true ) {
      do {
        j = pCVar6;
        pCVar6 = j + 1;
        bVar7 = false;
        if (j[1] != CVar1) {
          iVar4 = (*proc)(*pCVar6,CVar1,clientData);
          bVar7 = iVar4 < 0;
        }
      } while (bVar7);
      do {
        pCVar5 = k + -1;
        bVar7 = false;
        if (CVar1 != k[-1]) {
          iVar4 = (*proc)(CVar1,*pCVar5,clientData);
          bVar7 = iVar4 < 0;
        }
        k = pCVar5;
      } while ((bVar7) && (pCVar5 != last_local));
      if (pCVar5 <= pCVar6) break;
      CVar2 = *pCVar5;
      *pCVar5 = *pCVar6;
      *pCVar6 = CVar2;
      if ((*pCVar6 == CVar1) || (iVar4 = (*proc)(*pCVar6,CVar1,clientData), iVar4 == 0)) {
        q = q + 1;
        CVar2 = *pCVar6;
        *pCVar6 = *q;
        *q = CVar2;
      }
      if ((CVar1 == *pCVar5) || (iVar4 = (*proc)(CVar1,*pCVar5,clientData), iVar4 == 0)) {
        v = v - 8;
        CVar2 = *(Col_Word *)v;
        *(Col_Word *)v = *pCVar5;
        *pCVar5 = CVar2;
      }
    }
    CVar1 = *(Col_Word *)proc_local;
    *(Col_Word *)proc_local = *pCVar6;
    *pCVar6 = CVar1;
    k = j;
    j = j + 2;
    for (p = last_local; pCVar3 = proc_local, p < q; p = p + 1) {
      CVar1 = *k;
      *k = *p;
      *p = CVar1;
      k = k + -1;
    }
    while (p = (Col_Word *)(pCVar3 + -8), v < p) {
      CVar1 = *p;
      *p = *j;
      *j = CVar1;
      j = j + 1;
      pCVar3 = (Col_WordCompareProc *)p;
    }
    if ((long)k - (long)last_local >> 3 < (long)proc_local - (long)j >> 3) {
      Col_SortWords(last_local,k,proc,clientData);
      last_local = j;
    }
    else {
      Col_SortWords(j,(Col_Word *)proc_local,proc,clientData);
      proc_local = (Col_WordCompareProc *)k;
    }
  }
  return;
}

Assistant:

void
Col_SortWords(
    Col_Word *first,            /*!< First word of array to sort. */
    Col_Word *last,             /*!< Last word of array to sort. */
    Col_WordCompareProc *proc,  /*!< Comparison proc for sorting. */
    Col_ClientData clientData)  /*!< Opaque data passed as is to **proc**. */
{
/*! \cond IGNORE */
    Col_Word *i, *j, *k, *p, *q;
    Col_Word v;

#define SWAP(a, b) {Col_Word tmp=b; b=a; a=tmp;}

    /*
     * Entry point for tail recursive calls.
     */

#define TAIL_RECURSE(_first, _last) \
    first = (_first); last = (_last); goto start;

start:

    if (last <= first) return;
    i = p = first-1; j = q = last;
    v = *last;
    for (;;) {
        /*
         * Move from left to find an element that is not less.
         */

        while (*++i != v && proc(*i, v, clientData) < 0);

        /*
         * Move from right to find an element that is not greater.
         */

        while (v != *--j && proc(v, *j, clientData) < 0) if (j == first) break;

        /*
         * Stop if pointers have crossed.
         */

        if (i >= j) break;

        /*
         * Exchange.
         */

        SWAP(*i, *j);

        /*
         * If left element equal, exchange to left end.
         */

        if (*i == v || proc(*i, v, clientData) == 0) { p++; SWAP(*p, *i); }

        /*
         * If right element equal, exchange to right end.
         */

        if (v == *j || proc(v, *j, clientData) == 0) { q--; SWAP(*j, *q); }
    }
    SWAP(*i, *last); j = i-1; i = i+1;

    /*
     * Swap left equals to center.
     */

    for (k = first; k < p; k++, j--) SWAP(*k, *j);

    /*
     * Swap right equals to center.
     */

    for (k = last-1; k > q; k--, i++) SWAP(*i, *k);

    /*
     * Recurse on smallest subrange and tail call on largest to minimize
     * recursion depth and ensure O(logn) space.
     */

    if (j-first < last-i) {
        /*
         * Left subrange is shorter.
         */

        Col_SortWords(first, j, proc, clientData);
        TAIL_RECURSE(i, last);
    } else {
        /*
         * Right subrange is shorter.
         */

        Col_SortWords(i, last, proc, clientData);
        TAIL_RECURSE(first, j);
    }

#undef TAIL_RECURSE
#undef SWAP
/*! \endcond *//* IGNORE */
}